

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage_module.h
# Opt level: O0

void __thiscall shift_window_transformer::StageModule<float>::~StageModule(StageModule<float> *this)

{
  SwinBlock<float> *this_00;
  size_type sVar1;
  reference ppSVar2;
  int local_14;
  int i;
  StageModule<float> *this_local;
  
  (this->super_Layer<float>)._vptr_Layer = (_func_int **)&PTR_forward_0011c9b0;
  local_14 = 0;
  while( true ) {
    sVar1 = std::
            vector<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
            ::size(&this->layers);
    if (sVar1 <= (ulong)(long)local_14) break;
    ppSVar2 = std::
              vector<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
              ::operator[](&this->layers,(long)local_14);
    this_00 = *ppSVar2;
    if (this_00 != (SwinBlock<float> *)0x0) {
      SwinBlock<float>::~SwinBlock(this_00);
      operator_delete(this_00,0x38);
    }
    local_14 = local_14 + 1;
  }
  std::
  vector<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
  ::~vector(&this->layers);
  PatchMerging<float>::~PatchMerging(&this->patch_partition);
  return;
}

Assistant:

~StageModule() {
            for (int i = 0; i < layers.size(); ++i) {
                delete layers[i];
            }
        }